

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

uint8 * google::protobuf::internal::WireFormat::InternalSerializeMessageSetItem
                  (FieldDescriptor *field,Message *message,uint8 *target,EpsCopyOutputStream *stream
                  )

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Message *pMVar4;
  undefined4 extraout_var;
  uint uVar5;
  Reflection *this;
  uint8 *puVar6;
  uint8 *puVar7;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  *target = '\v';
  uVar2 = *(uint *)(field + 0x44);
  target[1] = '\x10';
  if (uVar2 < 0x80) {
    target[2] = (byte)uVar2;
    puVar6 = target + 3;
  }
  else {
    target[2] = (byte)uVar2 | 0x80;
    if (uVar2 < 0x4000) {
      target[3] = (uint8)(uVar2 >> 7);
      puVar6 = target + 4;
    }
    else {
      puVar6 = target + 4;
      uVar2 = uVar2 >> 7;
      do {
        puVar7 = puVar6;
        puVar7[-1] = (byte)uVar2 | 0x80;
        uVar5 = uVar2 >> 7;
        puVar6 = puVar7 + 1;
        bVar1 = 0x3fff < uVar2;
        uVar2 = uVar5;
      } while (bVar1);
      *puVar7 = (uint8)uVar5;
    }
  }
  pMVar4 = Reflection::GetMessage(this,message,field,(MessageFactory *)0x0);
  *puVar6 = '\x1a';
  uVar2 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[0xc])(pMVar4);
  if (uVar2 < 0x80) {
    puVar6[1] = (byte)uVar2;
    puVar6 = puVar6 + 2;
  }
  else {
    puVar6[1] = (byte)uVar2 | 0x80;
    if (uVar2 < 0x4000) {
      puVar6[2] = (uint8)(uVar2 >> 7);
      puVar6 = puVar6 + 3;
    }
    else {
      puVar6 = puVar6 + 3;
      uVar2 = uVar2 >> 7;
      do {
        puVar7 = puVar6;
        puVar7[-1] = (byte)uVar2 | 0x80;
        uVar5 = uVar2 >> 7;
        puVar6 = puVar7 + 1;
        bVar1 = 0x3fff < uVar2;
        uVar2 = uVar5;
      } while (bVar1);
      *puVar7 = (uint8)uVar5;
    }
  }
  iVar3 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[0xe])(pMVar4,puVar6,stream);
  puVar6 = (uint8 *)CONCAT44(extraout_var,iVar3);
  if (stream->end_ <= puVar6) {
    puVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar6);
  }
  *puVar6 = '\f';
  return puVar6 + 1;
}

Assistant:

uint8* WireFormat::InternalSerializeMessageSetItem(
    const FieldDescriptor* field, const Message& message, uint8* target,
    io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  stream->EnsureSpace(&target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, field->number(), target);
  // Write message.
  target = WireFormatLite::InternalWriteMessageToArray(
      WireFormatLite::kMessageSetMessageNumber,
      message_reflection->GetMessage(message, field), target, stream);
  // End group.
  stream->EnsureSpace(&target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}